

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullDevice.cpp
# Opt level: O3

void lateLoadNullDevice(void)

{
  int iVar1;
  MakeFunction local_68;
  FindFunction local_60;
  string local_58;
  string local_38;
  
  if (lateLoadNullDevice()::registerNullDevice == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadNullDevice()::registerNullDevice);
    if (iVar1 != 0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"null","");
      local_60 = findNullDevice;
      local_68 = makeNullDevice;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"0.7","");
      SoapySDR::Registry::Registry
                (&lateLoadNullDevice::registerNullDevice,&local_38,&local_60,&local_68,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      __cxa_atexit(SoapySDR::Registry::~Registry,&lateLoadNullDevice::registerNullDevice,
                   &__dso_handle);
      __cxa_guard_release(&lateLoadNullDevice()::registerNullDevice);
    }
  }
  return;
}

Assistant:

void lateLoadNullDevice(void)
{
    static SoapySDR::Registry registerNullDevice("null", &findNullDevice, &makeNullDevice, SOAPY_SDR_ABI_VERSION);
}